

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::preprocessor::new_empty_line(preprocessor *this,context_t *context)

{
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x221e21);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(in_RSI);
  *(undefined1 *)(in_RDI + 0x14) = 1;
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  return;
}

Assistant:

void new_empty_line(const context_t &context)
		{
			context->file_buff.emplace_back();
			empty_line = true;
			++line_num;
		}